

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CConnman::SetNetworkActive(CConnman *this,bool active)

{
  string_view source_file;
  bool bVar1;
  Logger *pLVar2;
  bool *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  atomic<bool> local_d2 [66];
  undefined8 local_90;
  char *pcStack_88;
  string local_70;
  char *local_50;
  size_t local_48;
  char local_40;
  undefined7 uStack_3f;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_d2[0]._M_base._M_i = (__atomic_base<bool>)(__atomic_base<bool>)active;
  pLVar2 = LogInstance();
  bVar1 = BCLog::Logger::Enabled(pLVar2);
  if (bVar1) {
    local_48 = 0;
    local_40 = '\0';
    local_50 = &local_40;
    tinyformat::format<char[17],bool>
              (&local_70,(tinyformat *)0xfc7a10,"SetNetworkActive",(char (*) [17])local_d2,in_R8);
    SetNetworkActive();
    pLVar2 = LogInstance();
    local_90 = 0x50;
    pcStack_88 = "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x50;
    str._M_str = local_50;
    str._M_len = local_48;
    logging_function._M_str = "SetNetworkActive";
    logging_function._M_len = 0x10;
    BCLog::Logger::LogPrintStr(pLVar2,str,logging_function,source_file,0xc58,ALL,Info);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
  }
  if (local_d2[0]._M_base._M_i != (__atomic_base<bool>)((this->fNetworkActive)._M_base._M_i & 1U)) {
    LOCK();
    (this->fNetworkActive)._M_base._M_i = (__int_type_conflict2)local_d2[0]._M_base._M_i;
    UNLOCK();
    if (this->m_client_interface != (CClientUIInterface *)0x0) {
      CClientUIInterface::NotifyNetworkActiveChanged
                (this->m_client_interface,(bool)((this->fNetworkActive)._M_base._M_i & 1));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::SetNetworkActive(bool active)
{
    LogPrintf("%s: %s\n", __func__, active);

    if (fNetworkActive == active) {
        return;
    }

    fNetworkActive = active;

    if (m_client_interface) {
        m_client_interface->NotifyNetworkActiveChanged(fNetworkActive);
    }
}